

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

char * archive_acl_to_text_l
                 (archive_acl *acl,ssize_t *text_len,wchar_t flags,archive_string_conv *sc)

{
  archive_acl *__s;
  int *piVar1;
  char *s;
  char *p;
  wchar_t local_70;
  wchar_t want_type;
  wchar_t r;
  wchar_t id;
  archive_acl_entry *ap;
  char *pcStack_58;
  char separator;
  char *prefix;
  char *name;
  size_t len;
  ssize_t length;
  archive_string_conv *paStack_30;
  wchar_t count;
  archive_string_conv *sc_local;
  size_t *psStack_20;
  wchar_t flags_local;
  ssize_t *text_len_local;
  archive_acl *acl_local;
  
  paStack_30 = sc;
  sc_local._4_4_ = flags;
  psStack_20 = (size_t *)text_len;
  text_len_local = (ssize_t *)acl;
  p._4_4_ = archive_acl_text_want_type(acl,flags);
  if (p._4_4_ == L'\0') {
    acl_local = (archive_acl *)0x0;
  }
  else {
    if (p._4_4_ == L'̀') {
      sc_local._4_4_ = sc_local._4_4_ | 2;
    }
    len = archive_acl_text_len
                    ((archive_acl *)text_len_local,p._4_4_,sc_local._4_4_,L'\0',(archive *)0x0,
                     paStack_30);
    if (len == 0) {
      acl_local = (archive_acl *)0x0;
    }
    else {
      if ((sc_local._4_4_ & 8U) == 0) {
        ap._7_1_ = '\n';
      }
      else {
        ap._7_1_ = ',';
      }
      __s = (archive_acl *)malloc(len);
      s = (char *)__s;
      if (__s == (archive_acl *)0x0) {
        piVar1 = __errno_location();
        if (*piVar1 == 0xc) {
          __archive_errx(1,"No memory");
        }
        acl_local = (archive_acl *)0x0;
      }
      else {
        length._4_4_ = 0;
        if ((p._4_4_ & 0x100U) != 0) {
          append_entry(&s,(char *)0x0,L'Ā',L'✒',sc_local._4_4_,(char *)0x0,
                       (uint)*text_len_local & 0x1c0,L'\xffffffff');
          *s = ap._7_1_;
          s = s + 1;
          append_entry(&s,(char *)0x0,L'Ā',L'✔',sc_local._4_4_,(char *)0x0,
                       (uint)*text_len_local & 0x38,L'\xffffffff');
          *s = ap._7_1_;
          s = s + 1;
          append_entry(&s,(char *)0x0,L'Ā',L'✖',sc_local._4_4_,(char *)0x0,
                       (uint)*text_len_local & 7,L'\xffffffff');
          length._4_4_ = length._4_4_ + 3;
        }
        for (_r = (undefined8 *)text_len_local[1]; _r != (undefined8 *)0x0; _r = (undefined8 *)*_r)
        {
          if (((*(uint *)(_r + 1) & p._4_4_) != 0) &&
             ((*(int *)(_r + 1) != 0x100 ||
              (((*(int *)((long)_r + 0xc) != 0x2712 && (*(int *)((long)_r + 0xc) != 0x2714)) &&
               (*(int *)((long)_r + 0xc) != 0x2716)))))) {
            if ((*(int *)(_r + 1) == 0x200) && ((sc_local._4_4_ & 2U) != 0)) {
              pcStack_58 = "default:";
            }
            else {
              pcStack_58 = (char *)0x0;
            }
            local_70 = archive_mstring_get_mbs_l
                                 ((archive *)0x0,(archive_mstring *)(_r + 3),&prefix,(size_t *)&name
                                  ,paStack_30);
            if (local_70 != L'\0') {
              free(__s);
              return (char *)0x0;
            }
            if (0 < length._4_4_) {
              *s = ap._7_1_;
              s = s + 1;
            }
            if ((prefix == (char *)0x0) || ((sc_local._4_4_ & 1U) != 0)) {
              want_type = *(wchar_t *)((long)_r + 0x14);
            }
            else {
              want_type = L'\xffffffff';
            }
            append_entry(&s,pcStack_58,*(wchar_t *)(_r + 1),*(wchar_t *)((long)_r + 0xc),
                         sc_local._4_4_,prefix,*(wchar_t *)(_r + 2),want_type);
            length._4_4_ = length._4_4_ + 1;
          }
        }
        *s = '\0';
        s = s + 1;
        name = (char *)strlen((char *)__s);
        if ((long)(len - 1) < (long)name) {
          __archive_errx(1,"Buffer overrun");
        }
        acl_local = __s;
        if (psStack_20 != (size_t *)0x0) {
          *psStack_20 = (size_t)name;
        }
      }
    }
  }
  return (char *)acl_local;
}

Assistant:

char *
archive_acl_to_text_l(struct archive_acl *acl, ssize_t *text_len, int flags,
    struct archive_string_conv *sc)
{
	int count;
	ssize_t length;
	size_t len;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	int id, r, want_type;
	char *p, *s;

	want_type = archive_acl_text_want_type(acl, flags);

	/* Both NFSv4 and POSIX.1 types found */
	if (want_type == 0)
		return (NULL);

	if (want_type == ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)
		flags |= ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	length = archive_acl_text_len(acl, want_type, flags, 0, NULL, sc);

	if (length == 0)
		return (NULL);

	if (flags & ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA)
		separator = ',';
	else
		separator = '\n';

	/* Now, allocate the string and actually populate it. */
	p = s = (char *)malloc(length * sizeof(char));
	if (p == NULL) {
		if (errno == ENOMEM)
			__archive_errx(1, "No memory");
		return (NULL);
	}
	count = 0;

	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_USER_OBJ, flags, NULL,
		    acl->mode & 0700, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_GROUP_OBJ, flags, NULL,
		    acl->mode & 0070, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_OTHER, flags, NULL,
		    acl->mode & 0007, -1);
		count += 3;
	}

	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		if (ap->type == ARCHIVE_ENTRY_ACL_TYPE_DEFAULT &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
			prefix = "default:";
		else
			prefix = NULL;
		r = archive_mstring_get_mbs_l(
		    NULL, &ap->name, &name, &len, sc);
		if (r != 0) {
			free(s);
			return (NULL);
		}
		if (count > 0)
			*p++ = separator;
		if (name == NULL ||
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)) {
			id = ap->id;
		} else {
			id = -1;
		}
		append_entry(&p, prefix, ap->type, ap->tag, flags, name,
		    ap->permset, id);
		count++;
	}

	/* Add terminating character */
	*p++ = '\0';

	len = strlen(s);

	if ((ssize_t)len > (length - 1))
		__archive_errx(1, "Buffer overrun");

	if (text_len != NULL)
		*text_len = len;

	return (s);
}